

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O1

unique_ptr<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>_>
__thiscall
jaegertracing::samplers::Config::makeSampler
          (Config *this,string *serviceName,Logger *logger,Metrics *metrics)

{
  pointer pcVar1;
  int iVar2;
  RateLimitingSampler *this_00;
  RemotelyControlledSampler *this_01;
  ostream *poVar3;
  invalid_argument *this_02;
  pointer *__ptr;
  Metrics *in_R8;
  undefined1 local_1f8 [8];
  shared_ptr<jaegertracing::samplers::Sampler> initSampler;
  element_type local_1e0 [2];
  string samplerType;
  ostringstream oss;
  char *local_1a0;
  char local_198 [16];
  pointer local_188;
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  size_type local_160;
  size_type sStack_158;
  ios_base local_138 [264];
  
  samplerType._M_dataplus._M_p = (pointer)&samplerType.field_2;
  samplerType._M_string_length = 0;
  samplerType.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&samplerType);
  pcVar1 = (serviceName->_M_dataplus)._M_p;
  std::
  transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>,jaegertracing::samplers::Config::makeSampler(std::__cxx11::string_const&,jaegertracing::logging::Logger&,jaegertracing::metrics::Metrics&)const::_lambda(char)_1_>
            (pcVar1,pcVar1 + serviceName->_M_string_length,&samplerType);
  iVar2 = std::__cxx11::string::compare((char *)&samplerType);
  if (iVar2 == 0) {
    this_00 = (RateLimitingSampler *)operator_new(0x28);
    ConstSampler::ConstSampler
              ((ConstSampler *)this_00,(bool)(-((double)serviceName[1]._M_dataplus._M_p != 0.0) & 1)
              );
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&samplerType);
    if (iVar2 == 0) {
      pcVar1 = serviceName[1]._M_dataplus._M_p;
      if (((double)pcVar1 < 0.0) || (1.0 < (double)pcVar1)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&oss,"Invalid parameter for probabilistic sampler: ",0x2d);
        poVar3 = std::ostream::_M_insert<double>((double)serviceName[1]._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,", expecting value between 0 and 1",0x21);
        std::__cxx11::stringbuf::str();
        (*(code *)(metrics->_tracesStartedSampled)._M_t.
                  super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
                  .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl[2].
                  _vptr_Counter)(metrics,&initSampler);
        if (initSampler.
            super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != local_1e0) {
          operator_delete(initSampler.
                          super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
        }
        this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (this_02,"Probabilistic sampling rate should be in the interval [0, 1].");
        __cxa_throw(this_02,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      this_00 = (RateLimitingSampler *)operator_new(0x30);
      ProbabilisticSampler::ProbabilisticSampler((ProbabilisticSampler *)this_00,(double)pcVar1);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&samplerType);
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)&samplerType);
        if ((iVar2 == 0) || (samplerType._M_string_length == 0)) {
          _oss = local_198;
          pcVar1 = (serviceName->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&oss,pcVar1,pcVar1 + serviceName->_M_string_length);
          local_188 = serviceName[1]._M_dataplus._M_p;
          local_180[0] = local_170;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_180,serviceName[1]._M_string_length,
                     serviceName[1].field_2._M_allocated_capacity + serviceName[1]._M_string_length)
          ;
          local_160 = serviceName[2]._M_string_length;
          sStack_158 = serviceName[2].field_2._M_allocated_capacity;
          std::__cxx11::string::_M_replace((ulong)&oss,0,local_1a0,0x226ae4);
          makeSampler((Config *)local_1f8,(string *)&oss,logger,metrics);
          std::__shared_ptr<jaegertracing::samplers::Sampler,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<jaegertracing::samplers::Sampler,std::default_delete<jaegertracing::samplers::Sampler>,void>
                    ((__shared_ptr<jaegertracing::samplers::Sampler,(__gnu_cxx::_Lock_policy)2> *)
                     &initSampler,
                     (unique_ptr<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>_>
                      *)local_1f8);
          if (local_1f8 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_1f8 + 8))();
          }
          if (initSampler.
              super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr == (element_type *)0x0) {
            (this->_type)._M_dataplus._M_p = (pointer)0x0;
            this_01 = (RemotelyControlledSampler *)0x0;
          }
          else {
            this_01 = (RemotelyControlledSampler *)operator_new(0xf0);
            RemotelyControlledSampler::RemotelyControlledSampler
                      (this_01,(string *)logger,(string *)&serviceName[1]._M_string_length,
                       &initSampler,(int)serviceName[2]._M_string_length,
                       (duration *)&serviceName[2].field_2._M_allocated_capacity,(Logger *)metrics,
                       in_R8);
          }
          (this->_type)._M_dataplus._M_p = (pointer)this_01;
          if (initSampler.
              super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (initSampler.
                       super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_180[0] != local_170) {
            operator_delete(local_180[0]);
          }
          if (_oss != local_198) {
            operator_delete(_oss);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&oss,"Unknown sampler type ",0x15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&oss,(serviceName->_M_dataplus)._M_p,serviceName->_M_string_length);
          std::__cxx11::stringbuf::str();
          (*(code *)(metrics->_tracesStartedSampled)._M_t.
                    super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
                    .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl[2]
                    ._vptr_Counter)(metrics,&initSampler);
          if (initSampler.
              super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != local_1e0) {
            operator_delete(initSampler.
                            super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
          }
          (this->_type)._M_dataplus._M_p = (pointer)0x0;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
          std::ios_base::~ios_base(local_138);
        }
        goto LAB_001bc2f0;
      }
      this_00 = (RateLimitingSampler *)operator_new(0x70);
      RateLimitingSampler::RateLimitingSampler(this_00,(double)serviceName[1]._M_dataplus._M_p);
    }
  }
  (this->_type)._M_dataplus._M_p = (pointer)this_00;
LAB_001bc2f0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)samplerType._M_dataplus._M_p != &samplerType.field_2) {
    operator_delete(samplerType._M_dataplus._M_p);
  }
  return (__uniq_ptr_data<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>,_true,_true>
          )(__uniq_ptr_data<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Sampler> makeSampler(const std::string& serviceName,
                                         logging::Logger& logger,
                                         metrics::Metrics& metrics) const
    {
        std::string samplerType;
        samplerType.reserve(_type.size());
        std::transform(std::begin(_type),
                       std::end(_type),
                       std::back_inserter(samplerType),
                       [](const char ch) { return std::tolower(ch); });
        if (samplerType == kSamplerTypeConst) {
            return std::unique_ptr<ConstSampler>(new ConstSampler(_param != 0));
        }

        if (samplerType == kSamplerTypeProbabilistic) {
            if (_param >= 0 && _param <= 1) {
                return std::unique_ptr<ProbabilisticSampler>(
                    new ProbabilisticSampler(_param));
            }
            else {
                std::ostringstream oss;
                oss << "Invalid parameter for probabilistic sampler: " << _param
                    << ", expecting value between 0 and 1";
                logger.error(oss.str());
                throw std::invalid_argument("Probabilistic sampling rate should be in the interval [0, 1].");
                return std::unique_ptr<Sampler>();
            }
        }

        if (samplerType == kSamplerTypeRateLimiting) {
            return std::unique_ptr<RateLimitingSampler>(
                new RateLimitingSampler(_param));
        }

        if (samplerType == kSamplerTypeRemote || samplerType.empty()) {
            auto config = *this;
            config._type = kSamplerTypeProbabilistic;
            std::shared_ptr<Sampler> initSampler(
                config.makeSampler(serviceName, logger, metrics));
            if (!initSampler) {
                return std::unique_ptr<Sampler>();
            }

            return std::unique_ptr<RemotelyControlledSampler>(
                new RemotelyControlledSampler(serviceName,
                                              _samplingServerURL,
                                              initSampler,
                                              _maxOperations,
                                              _samplingRefreshInterval,
                                              logger,
                                              metrics));
        }

        std::ostringstream oss;
        oss << "Unknown sampler type " << _type;
        logger.error(oss.str());
        return std::unique_ptr<Sampler>();
    }